

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioSop.c
# Opt level: O2

Vec_Int_t * Mio_SopCoverAnd(Vec_Int_t *p,Vec_Int_t *q)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *p_00;
  int i;
  int i_00;
  
  p_00 = Vec_IntAlloc(q->nSize * p->nSize);
  for (i = 0; i < p->nSize; i = i + 1) {
    uVar1 = Vec_IntEntry(p,i);
    for (i_00 = 0; i_00 < q->nSize; i_00 = i_00 + 1) {
      uVar2 = Vec_IntEntry(q,i_00);
      uVar2 = uVar2 | uVar1;
      if ((uVar2 >> 1 & uVar2 & 0x55555555) == 0) {
        Mio_SopPushSCC(p_00,uVar2);
      }
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Mio_SopCoverAnd( Vec_Int_t * p, Vec_Int_t * q )
{
    Vec_Int_t * r;
    unsigned EntryP, EntryQ;
    int i, k;
    r = Vec_IntAlloc( Vec_IntSize(p) * Vec_IntSize(q) );
    Vec_IntForEachEntry( p, EntryP, i )
        Vec_IntForEachEntry( q, EntryQ, k )
            if ( !Mio_CubeEmpty( Mio_CubeAnd(EntryP, EntryQ) ) )
                Mio_SopPushSCC( r, Mio_CubeAnd(EntryP, EntryQ) );
    return r;
}